

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

double __thiscall libDAI::TProb<double>::maxAbs(TProb<double> *this)

{
  pointer pdVar1;
  size_t i;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar3 = ZEXT816(0) << 0x40;
  lVar2 = 0;
  while ((long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pdVar1 >> 3 != lVar2) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pdVar1[lVar2];
    lVar2 = lVar2 + 1;
    auVar5 = vandpd_avx(auVar5,auVar4);
    auVar3 = vmaxsd_avx(auVar5,auVar3);
  }
  return auVar3._0_8_;
}

Assistant:

T maxAbs() const {
                T Z = 0.0;
                for( size_t i = 0; i < size(); i++ ) {
                    Real mag = fabs( (Real) _p[i] );
                    if( mag > Z )
                        Z = mag;
                }
                return Z;
            }